

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDChoice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLevelMax;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  local_54 = 1000;
  local_50 = 1;
  local_48 = 0;
  nLevelMax = 0;
  local_4c = local_50;
LAB_0022ef3e:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CLblcvh");
    iVar5 = globalUtilOptind;
    if (iVar1 == 0x4c) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0022f04b:
        Abc_Print(-1,pcVar4);
        goto LAB_0022f055;
      }
      nLevelMax = atoi(argv[globalUtilOptind]);
      uVar2 = nLevelMax;
    }
    else {
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pAVar3->ntkType == ABC_NTK_STRASH) {
            pAVar3 = Abc_NtkDChoice(pAVar3,local_50,local_4c,local_48,local_54,nLevelMax,local_44);
            if (pAVar3 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar4 = "This command works only for strashed networks.\n";
        }
        iVar5 = -1;
        goto LAB_0022f126;
      }
      if (iVar1 == 0x76) {
        local_44 = local_44 ^ 1;
        goto LAB_0022ef3e;
      }
      if (iVar1 == 0x62) {
        local_50 = local_50 ^ 1;
        goto LAB_0022ef3e;
      }
      if (iVar1 == 99) {
        local_48 = local_48 ^ 1;
        goto LAB_0022ef3e;
      }
      if (iVar1 == 0x6c) {
        local_4c = local_4c ^ 1;
        goto LAB_0022ef3e;
      }
      if (iVar1 != 0x43) goto LAB_0022f055;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0022f04b;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0022f055:
      iVar5 = -2;
      Abc_Print(-2,"usage: dchoice [-C num] [-L num] [-blcvh]\n");
      Abc_Print(-2,"\t         performs partitioned choicing using new AIG package\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-L num : the max level of nodes to consider (0 = not used) [default = %d]\n",
                (ulong)nLevelMax);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (local_50 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle updating level [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle constructive computation of choices [default = %s]\n",pcVar4);
      if (local_44 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0022f126:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDChoice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, fUpdateLevel, fConstruct, c;
    int nConfMax, nLevelMax;

    extern Abc_Ntk_t * Abc_NtkDChoice( Abc_Ntk_t * pNtk, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance     = 1;
    fUpdateLevel = 1;
    fConstruct   = 0;
    nConfMax     = 1000;
    nLevelMax    = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLblcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'b':
            fBalance ^= 1;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'c':
            fConstruct ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDChoice( pNtk, fBalance, fUpdateLevel, fConstruct, nConfMax, nLevelMax, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dchoice [-C num] [-L num] [-blcvh]\n" );
    Abc_Print( -2, "\t         performs partitioned choicing using new AIG package\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-L num : the max level of nodes to consider (0 = not used) [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle updating level [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle constructive computation of choices [default = %s]\n", fConstruct? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}